

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_char(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          char_type value)

{
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar1;
  size_t in_RCX;
  void *in_RDX;
  char_writer local_9;
  
  if (this->specs_ != (basic_format_specs<char> *)0x0) {
    local_9.value = value;
    bVar1 = write_padded<(fmt::v6::align::type)1,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::char_writer>
                      ((this->out_).container,this->specs_,1,&local_9);
    (this->out_).container = bVar1.container;
    return;
  }
  write(this,(int)value,in_RDX,in_RCX);
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      out_ = write_padded(out_, *specs_, 1, char_writer{value});
    else
      write(value);
  }